

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# WordTagger.pb.h
# Opt level: O2

bool CoreML::Specification::operator==(WordTagger *a,WordTagger *b)

{
  size_t __n;
  bool bVar1;
  int iVar2;
  undefined8 *puVar3;
  undefined8 *puVar4;
  
  if (a->revision_ != b->revision_) {
    return false;
  }
  bVar1 = std::operator!=((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                          ((ulong)(a->language_).tagged_ptr_.ptr_ & 0xfffffffffffffffe),
                          (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                          ((ulong)(b->language_).tagged_ptr_.ptr_ & 0xfffffffffffffffe));
  if (((((!bVar1) &&
        (bVar1 = std::operator!=((basic_string<char,_std::char_traits<char>,_std::allocator<char>_>
                                  *)((ulong)(a->tokensoutputfeaturename_).tagged_ptr_.ptr_ &
                                    0xfffffffffffffffe),
                                 (basic_string<char,_std::char_traits<char>,_std::allocator<char>_>
                                  *)((ulong)(b->tokensoutputfeaturename_).tagged_ptr_.ptr_ &
                                    0xfffffffffffffffe)), !bVar1)) &&
       (bVar1 = std::operator!=((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *
                                )((ulong)(a->tokentagsoutputfeaturename_).tagged_ptr_.ptr_ &
                                 0xfffffffffffffffe),
                                (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *
                                )((ulong)(b->tokentagsoutputfeaturename_).tagged_ptr_.ptr_ &
                                 0xfffffffffffffffe)), !bVar1)) &&
      ((bVar1 = std::operator!=((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *
                                )((ulong)(a->tokenlocationsoutputfeaturename_).tagged_ptr_.ptr_ &
                                 0xfffffffffffffffe),
                                (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *
                                )((ulong)(b->tokenlocationsoutputfeaturename_).tagged_ptr_.ptr_ &
                                 0xfffffffffffffffe)), !bVar1 &&
       (bVar1 = std::operator!=((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *
                                )((ulong)(a->tokenlengthsoutputfeaturename_).tagged_ptr_.ptr_ &
                                 0xfffffffffffffffe),
                                (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *
                                )((ulong)(b->tokenlengthsoutputfeaturename_).tagged_ptr_.ptr_ &
                                 0xfffffffffffffffe)), !bVar1)))) &&
     ((a->_oneof_case_[0] == b->_oneof_case_[0] &&
      ((a->_oneof_case_[0] != 200 ||
       (bVar1 = operator!=((a->Tags_).stringtags_,(b->Tags_).stringtags_), !bVar1)))))) {
    puVar3 = (undefined8 *)((ulong)(a->modelparameterdata_).tagged_ptr_.ptr_ & 0xfffffffffffffffe);
    __n = puVar3[1];
    puVar4 = (undefined8 *)((ulong)(b->modelparameterdata_).tagged_ptr_.ptr_ & 0xfffffffffffffffe);
    if ((__n == puVar4[1]) &&
       ((__n == 0 || (iVar2 = bcmp((void *)*puVar3,(void *)*puVar4,__n), iVar2 == 0)))) {
      return true;
    }
  }
  return false;
}

Assistant:

inline uint32_t WordTagger::_internal_revision() const {
  return revision_;
}